

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::allocate
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *pc,void *addr,size_t size)

{
  bool bVar1;
  iterator local_b0;
  iterator local_70;
  lock_guard<std::shared_mutex> local_40;
  lock_guard<std::shared_mutex> exLockT;
  size_t address;
  size_t size_local;
  void *addr_local;
  void *pc_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  exLockT._M_device = (mutex_type *)addr;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_40,&this->g_lock);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::find<unsigned_long>
            (&local_70,
             (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&this->allocs,(key_arg<unsigned_long> *)&exLockT);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::end(&local_b0,
        (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)&this->allocs);
  bVar1 = phmap::container_internal::operator==(&local_70,&local_b0);
  if (bVar1) {
    create_alloc(this,(size_t)exLockT._M_device,size);
  }
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_40);
  return;
}

Assistant:

void allocate(tls_t tls, void* pc, void* addr, size_t size) final {
#if REGARD_ALLOCS
    size_t address = reinterpret_cast<size_t>(addr);
    std::lock_guard<LockT> exLockT(g_lock);
    if (allocs.find(address) == allocs.end()) {
      create_alloc(address, size);
    }
#endif
  }